

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O0

void radio_number(t_radio *x,t_floatarg num)

{
  int iVar1;
  int local_18;
  int vis;
  int n;
  t_floatarg num_local;
  t_radio *x_local;
  
  local_18 = (int)num;
  if (local_18 < 1) {
    local_18 = 1;
  }
  if (0x80 < local_18) {
    local_18 = 0x80;
  }
  if (local_18 != x->x_number) {
    iVar1 = glist_isvisible((x->x_gui).x_glist);
    if (iVar1 != 0) {
      (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,4);
    }
    x->x_number = local_18;
    if (x->x_number <= x->x_on) {
      x->x_on = x->x_number + -1;
    }
    x->x_on_old = x->x_on;
    if ((iVar1 != 0) && (iVar1 = gobj_shouldvis((t_gobj *)x,(x->x_gui).x_glist), iVar1 != 0)) {
      (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,2);
      canvas_fixlinesfor((x->x_gui).x_glist,(t_text *)x);
    }
  }
  return;
}

Assistant:

static void radio_number(t_radio *x, t_floatarg num)
{
    int n = (int)num;

    if(n < 1)
        n = 1;
    if(n > IEM_RADIO_MAX)
        n = IEM_RADIO_MAX;
    if(n != x->x_number)
    {
        int vis = glist_isvisible(x->x_gui.x_glist);
        if(vis)
            (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_ERASE);
        x->x_number = n;
        if(x->x_on >= x->x_number)
            x->x_on = x->x_number - 1;
        x->x_on_old = x->x_on;
        if(vis && gobj_shouldvis((t_gobj *)x, x->x_gui.x_glist))
        {
            (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_NEW);
            canvas_fixlinesfor(x->x_gui.x_glist, (t_text*)x);
        }
    }
}